

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ConcurrentQueue(ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
                  *this,size_t capacity)

{
  size_t capacity_local;
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
  *this_local;
  memory_order __b;
  
  std::
  atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
  ::atomic(&this->producerListTail,(__pointer_type)0x0);
  std::atomic<unsigned_int>::atomic(&this->producerCount,0);
  std::atomic<unsigned_long>::atomic(&this->initialBlockPoolIndex,0);
  FreeList<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::Block>
  ::FreeList(&this->freeList);
  std::
  array<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP,_32UL>
  ::array(&this->initialImplicitProducerHashEntries);
  std::atomic<unsigned_int>::atomic(&this->nextExplicitConsumerId,0);
  std::atomic<unsigned_int>::atomic(&this->globalExplicitConsumerOffset,0);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->implicitProducerHashResizeInProgress).super___atomic_flag_base._M_i = false;
  populate_initial_implicit_producer_hash(this);
  populate_initial_block_list(this,(capacity >> 5) + (long)(int)(uint)((capacity & 0x1f) != 0));
  return;
}

Assistant:

explicit ConcurrentQueue(size_t capacity = 6 * BLOCK_SIZE)
		: producerListTail(nullptr),
		producerCount(0),
		initialBlockPoolIndex(0),
		nextExplicitConsumerId(0),
		globalExplicitConsumerOffset(0)
	{
		implicitProducerHashResizeInProgress.clear(std::memory_order_relaxed);
		populate_initial_implicit_producer_hash();
		populate_initial_block_list(capacity / BLOCK_SIZE + ((capacity & (BLOCK_SIZE - 1)) == 0 ? 0 : 1));
		
#ifdef MOODYCAMEL_QUEUE_INTERNAL_DEBUG
		// Track all the producers using a fully-resolved typed list for
		// each kind; this makes it possible to debug them starting from
		// the root queue object (otherwise wacky casts are needed that
		// don't compile in the debugger's expression evaluator).
		explicitProducers.store(nullptr, std::memory_order_relaxed);
		implicitProducers.store(nullptr, std::memory_order_relaxed);
#endif
	}